

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

ptrdiff_t Parser_getNextToken(Parser *xmlParser)

{
  int iVar1;
  Parser *local_40;
  ptrdiff_t iIndex;
  Parser *pPStack_30;
  int rc;
  ptrdiff_t tlen;
  Parser *pPStack_20;
  int temp;
  ptrdiff_t tokenLength;
  Parser *xmlParser_local;
  
  pPStack_20 = (Parser *)0x0;
  tokenLength = (ptrdiff_t)xmlParser;
  Parser_clearTokenBuf(xmlParser);
  if (**(char **)(tokenLength + 8) == '\0') {
    xmlParser_local = (Parser *)0x0;
  }
  else {
    iVar1 = Parser_skipMisc((Parser *)tokenLength);
    if (iVar1 == 0) {
      if (**(char **)(tokenLength + 8) == '\"') {
        pPStack_20 = (Parser *)0x1;
      }
      else if (**(char **)(tokenLength + 8) == '\'') {
        pPStack_20 = (Parser *)0x1;
      }
      else if (**(char **)(tokenLength + 8) == '<') {
        tlen._4_4_ = Parser_UTF8ToInt((char *)(*(long *)(tokenLength + 8) + 1),
                                      (ptrdiff_t *)&stack0xffffffffffffffd0);
        if (tlen._4_4_ == 0x2f) {
          pPStack_20 = (Parser *)0x2;
        }
        else {
          iVar1 = Parser_isNameChar(tlen._4_4_,0);
          if (iVar1 == 0) {
            return 0;
          }
          pPStack_20 = (Parser *)0x1;
        }
      }
      else if (**(char **)(tokenLength + 8) == '=') {
        pPStack_20 = (Parser *)0x1;
      }
      else if (**(char **)(tokenLength + 8) == '/') {
        if (*(char *)(*(long *)(tokenLength + 8) + 1) == '>') {
          pPStack_20 = (Parser *)0x2;
          *(undefined8 *)(tokenLength + 0x10) = *(undefined8 *)(tokenLength + 8);
        }
      }
      else if (**(char **)(tokenLength + 8) == '>') {
        pPStack_20 = (Parser *)0x1;
      }
      else {
        iVar1 = Parser_UTF8ToInt(*(char **)(tokenLength + 8),(ptrdiff_t *)&stack0xffffffffffffffd0);
        iVar1 = Parser_isNameChar(iVar1,0);
        if (iVar1 == 0) {
          return 0;
        }
        local_40 = pPStack_30;
        while( true ) {
          iVar1 = Parser_UTF8ToInt((char *)((long)&local_40->dataBuffer + *(long *)(tokenLength + 8)
                                           ),(ptrdiff_t *)&stack0xffffffffffffffd0);
          iVar1 = Parser_isNameChar(iVar1,1);
          if (iVar1 == 0) break;
          local_40 = (Parser *)((long)&local_40->dataBuffer + (long)&pPStack_30->dataBuffer);
        }
        pPStack_20 = local_40;
      }
      iVar1 = Parser_copyToken((Parser *)tokenLength,*(char **)(tokenLength + 8),
                               (ptrdiff_t)pPStack_20);
      if (iVar1 == 0) {
        *(long *)(tokenLength + 8) = (long)&pPStack_20->dataBuffer + *(long *)(tokenLength + 8);
        xmlParser_local = pPStack_20;
      }
      else {
        xmlParser_local = (Parser *)0x0;
      }
    }
    else {
      xmlParser_local = (Parser *)0x0;
    }
  }
  return (ptrdiff_t)xmlParser_local;
}

Assistant:

static ptrdiff_t Parser_getNextToken(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	ptrdiff_t tokenLength = 0;
	int temp;
	ptrdiff_t tlen;
	int rc;

	Parser_clearTokenBuf(xmlParser);

	if (*(xmlParser->curPtr) == '\0') {
		return 0;
	}
	/* skip XML instructions */
	rc = Parser_skipMisc(xmlParser);
	if (rc != IXML_SUCCESS) {
		return 0;
	}
	/* Attribute value logic must come first, since all text untokenized
	 * until end-quote */
	if (*(xmlParser->curPtr) == QUOTE) {
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == SINGLEQUOTE) {
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == LESSTHAN) {
		/* Check for start tags */
		temp = Parser_UTF8ToInt(xmlParser->curPtr + 1, &tlen);
		if (temp == '/') {
			/* token is '</' end tag */
			tokenLength = 2;
		} else if (Parser_isNameChar(temp, 0)) {
			/* '<' found, so return '<' token */
			tokenLength = 1;
		} else {
			/* error */
			return 0;
		}
	} else if (*(xmlParser->curPtr) == EQUALS) {
		/* Check for '=' token, return it as a token */
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == SLASH) {
		if (*(xmlParser->curPtr + 1) == GREATERTHAN) {
			/* token '/>' found */
			tokenLength = 2;
			/* fix */
			xmlParser->savePtr = xmlParser->curPtr;
		}
	} else if (*(xmlParser->curPtr) == GREATERTHAN) {
		/* > found, so return it as a token */
		tokenLength = 1;
	} else if (Parser_isNameChar(
			   Parser_UTF8ToInt(xmlParser->curPtr, &tlen), 0)) {
		/* Check for name tokens, name found, so find out how long it is
		 */
		ptrdiff_t iIndex = tlen;

		while (Parser_isNameChar(
			Parser_UTF8ToInt(xmlParser->curPtr + iIndex, &tlen),
			1)) {
			iIndex += tlen;
		}
		tokenLength = iIndex;
	} else {
		return 0;
	}

	/* Copy the token to the return string */
	if (Parser_copyToken(xmlParser, xmlParser->curPtr, tokenLength) !=
		IXML_SUCCESS) {
		return 0;
	}

	xmlParser->curPtr += tokenLength;
	return tokenLength;
}